

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall ThreadPool::resize(ThreadPool *this,size_t threads)

{
  imageException *this_00;
  mutex *pmVar1;
  mutex *pmVar2;
  mutex *in_RSI;
  _func_void_ThreadPool_ptr_unsigned_long *in_RDI;
  unique_lock<std::mutex> _mutexLock;
  mutex_type *in_stack_ffffffffffffff28;
  unique_lock<std::mutex> *in_stack_ffffffffffffff30;
  condition_variable *in_stack_ffffffffffffff38;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff40;
  anon_class_8_1_8991fb9c __p;
  value_type_conflict2 *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  pointer local_38;
  undefined1 local_1e;
  undefined1 local_1d;
  mutex *local_10;
  
  if (in_RSI != (mutex *)0x0) {
    local_10 = in_RSI;
    pmVar1 = (mutex *)threadCount((ThreadPool *)0x1303b4);
    if (pmVar1 < in_RSI) {
      std::mutex::lock((mutex *)in_stack_ffffffffffffff30);
      local_1d = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (in_stack_ffffffffffffff60,(size_type)in_RSI,in_stack_ffffffffffffff50);
      local_1e = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (in_stack_ffffffffffffff60,(size_type)in_RSI,in_stack_ffffffffffffff50);
      std::mutex::unlock((mutex *)0x130433);
      *(mutex **)(in_RDI + 0xd8) = local_10;
      while (pmVar1 = local_10, pmVar2 = (mutex *)threadCount((ThreadPool *)0x13045e),
            pmVar2 < pmVar1) {
        local_38 = (pointer)threadCount((ThreadPool *)0x130481);
        std::thread::thread<void(&)(ThreadPool*,unsigned_long),ThreadPool*,unsigned_long,void>
                  ((thread *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_RDI,
                   (ThreadPool **)in_stack_ffffffffffffff60,(unsigned_long *)in_RSI);
        std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                  ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff30,
                   (value_type *)in_stack_ffffffffffffff28);
        std::thread::~thread((thread *)0x1304d0);
      }
      __p.this = (ThreadPool *)&stack0xffffffffffffffb8;
      std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
      ;
      std::condition_variable::wait<ThreadPool::resize(unsigned_long)::__0>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__p);
      std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff30);
    }
    else {
      __last._M_current = (uchar *)local_10;
      pmVar1 = (mutex *)threadCount((ThreadPool *)0x130590);
      if (__last._M_current < pmVar1) {
        std::mutex::lock((mutex *)in_stack_ffffffffffffff30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff28);
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)__last._M_current,(difference_type)in_stack_ffffffffffffff30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff28);
        std::
        fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
                  (in_stack_ffffffffffffff40,__last,(int *)in_stack_ffffffffffffff30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff28);
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)__last._M_current,(difference_type)in_stack_ffffffffffffff30);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff28);
        std::
        fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
                  (in_stack_ffffffffffffff40,__last,(int *)in_stack_ffffffffffffff30);
        std::condition_variable::notify_all();
        std::mutex::unlock((mutex *)0x130689);
        while (pmVar1 = local_10, pmVar2 = (mutex *)threadCount((ThreadPool *)0x1306a0),
              pmVar1 < pmVar2) {
          std::vector<std::thread,_std::allocator<std::thread>_>::back
                    ((vector<std::thread,_std::allocator<std::thread>_> *)pmVar1);
          std::thread::join();
          std::vector<std::thread,_std::allocator<std::thread>_>::pop_back
                    ((vector<std::thread,_std::allocator<std::thread>_> *)0x1306c9);
          std::mutex::lock(pmVar1);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1306e8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1306f6);
          std::mutex::unlock((mutex *)0x130707);
        }
      }
    }
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,in_stack_ffffffffffffff58);
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ThreadPool::resize( size_t threads )
{
    if( threads == 0 )
        throw imageException( "Try to set zero threads in thread pool" );

    if( threads > threadCount() ) {
        _taskInfo.lock();
        _run.resize( threads, 1 );
        _exit.resize( threads, 0 );
        _taskInfo.unlock();

        _threadCount = threads;

        while( threads > threadCount() )
            _worker.push_back( std::thread ( ThreadPool::_workerThread, this, threadCount() ) );

        std::unique_lock < std::mutex > _mutexLock( _creation );
        _completeCreation.wait( _mutexLock, [&] { return _threadsCreated; } );
    }
    else if( threads < threadCount() ) {
        _taskInfo.lock();

        std::fill( _exit.begin() + static_cast<std::vector < uint8_t >::difference_type>(threads), _exit.end(), 1 );
        std::fill( _run.begin()  + static_cast<std::vector < uint8_t >::difference_type>(threads), _run.end(), 1 );
        _waiting.notify_all();

        _taskInfo.unlock();

        while( threads < threadCount() ) {
            _worker.back().join();

            _worker.pop_back();

            _taskInfo.lock();

            _exit.pop_back();
            _run.pop_back();

            _taskInfo.unlock();
        }
    }
}